

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O0

void event_signal_birthpoints(int *points,int *inc_points,wchar_t remaining)

{
  undefined1 local_50 [8];
  game_event_data data;
  int *piStack_18;
  wchar_t remaining_local;
  int *inc_points_local;
  int *points_local;
  
  local_50 = (undefined1  [8])points;
  data.birthpoints.points = inc_points;
  data.message.type = remaining;
  data.explosion.centre.y = remaining;
  piStack_18 = inc_points;
  inc_points_local = points;
  game_event_dispatch(EVENT_BIRTHPOINTS,(game_event_data *)local_50);
  return;
}

Assistant:

void event_signal_birthpoints(const int *points, const int *inc_points,
		int remaining)
{
	game_event_data data;

	data.birthpoints.points = points;
	data.birthpoints.inc_points = inc_points;
	data.birthpoints.remaining = remaining;

	game_event_dispatch(EVENT_BIRTHPOINTS, &data);
}